

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
ExpressionRunnerRunAndDispose(ExpressionRunnerRef runner,BinaryenExpressionRef expr)

{
  Expression *pEVar1;
  undefined1 local_70 [8];
  Flow flow;
  
  wasm::ExpressionRunner<wasm::CExpressionRunner>::visit
            ((Flow *)local_70,(ExpressionRunner<wasm::CExpressionRunner> *)runner,expr);
  if ((flow.breakTo.super_IString.str._M_len == 0) &&
     (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_start -
             flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
      -0x5555555555555555 + (long)local_70 != 0)) {
    pEVar1 = wasm::Flow::getConstExpression
                       ((Flow *)local_70,
                        (runner->super_ConstantExpressionRunner<wasm::CExpressionRunner>).
                        super_ExpressionRunner<wasm::CExpressionRunner>.module);
  }
  else {
    pEVar1 = (BinaryenExpressionRef)0x0;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&flow);
  (runner->super_ConstantExpressionRunner<wasm::CExpressionRunner>).
  super_ExpressionRunner<wasm::CExpressionRunner>._vptr_ExpressionRunner =
       (_func_int **)&PTR__ConstantExpressionRunner_01077c40;
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(runner->super_ConstantExpressionRunner<wasm::CExpressionRunner>).globalValues._M_h
               );
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(runner->super_ConstantExpressionRunner<wasm::CExpressionRunner>).localValues._M_h)
  ;
  operator_delete(runner,0x98);
  return pEVar1;
}

Assistant:

BinaryenExpressionRef
ExpressionRunnerRunAndDispose(ExpressionRunnerRef runner,
                              BinaryenExpressionRef expr) {
  auto* R = (CExpressionRunner*)runner;
  Expression* ret = nullptr;
  try {
    auto flow = R->visit(expr);
    if (!flow.breaking() && !flow.values.empty()) {
      ret = flow.getConstExpression(*R->getModule());
    }
  } catch (NonconstantException&) {
  }
  delete R;
  return ret;
}